

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotStemsEx<ImPlot::GetterXsYs<short>,ImPlot::GetterXsYRef<short>>
               (char *label_id,GetterXsYs<short> *get_mark,GetterXsYRef<short> *get_base)

{
  double dVar1;
  double dVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar12;
  double dVar13;
  ImPlotContext *pIVar14;
  GetterXsYs<short> *getter1;
  bool bVar15;
  ImU32 col;
  long lVar16;
  long lVar17;
  byte bVar18;
  short *psVar19;
  byte bVar20;
  short *psVar21;
  ImPlotRange *pIVar22;
  int iVar23;
  int iVar24;
  float fVar25;
  double dVar26;
  double dVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  float fVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined8 local_a0;
  float local_94;
  uint local_90;
  uint local_8c;
  GetterXsYRef<short> *local_88;
  undefined8 local_80;
  short *local_78;
  GetterXsYs<short> *local_70;
  long local_68;
  ulong local_60;
  short *local_58;
  short *local_50;
  short *local_48;
  uint local_3c;
  ImPlotContext *local_38;
  
  bVar15 = BeginItem(label_id,0);
  pIVar14 = GImPlot;
  if (bVar15) {
    if ((GImPlot->FitThisFrame == true) && (iVar5 = get_base->Count, 0 < iVar5)) {
      local_78 = get_mark->Xs;
      local_38 = (ImPlotContext *)get_mark->Ys;
      iVar23 = get_mark->Count;
      pIVar12 = GImPlot->CurrentPlot;
      iVar6 = pIVar12->CurrentYAxis;
      uVar7 = (pIVar12->XAxis).Flags;
      pIVar22 = GImPlot->ExtentsY + iVar6;
      uVar8 = pIVar12->YAxis[iVar6].Flags;
      dVar1 = get_base->YRef;
      local_58 = (short *)((ulong)dVar1 & 0x7fffffffffffffff);
      bVar18 = dVar1 <= 0.0 & (byte)(uVar8 >> 5) & 7;
      local_68 = CONCAT71(local_68._1_7_,bVar18);
      bVar20 = (short *)0x7fefffffffffffff < local_58 | bVar18;
      local_60 = CONCAT71(local_60._1_7_,bVar20);
      local_8c = uVar8 & 0x20;
      local_90 = local_8c >> 5;
      local_80 = (ImDrawList *)(CONCAT44(local_80._4_4_,uVar7) & 0xffffffff00000020);
      local_94 = (float)((uVar7 & 0x20) >> 5);
      uVar9 = get_mark->Offset;
      local_48 = (short *)(ulong)uVar9;
      local_50 = (short *)(long)get_mark->Stride;
      psVar19 = get_base->Xs;
      iVar10 = get_base->Offset;
      iVar11 = get_base->Stride;
      iVar24 = 0;
      do {
        lVar16 = (long)(((int)(uVar9 + iVar24) % iVar23 + iVar23) % iVar23) * (long)local_50;
        sVar3 = *(short *)((long)local_78 + lVar16);
        dVar27 = (double)(int)sVar3;
        sVar4 = *(short *)((long)local_38 + lVar16);
        dVar26 = (double)(int)sVar4;
        if ((uVar7 >> 10 & 1) == 0) {
          if ((0 < sVar3) || ((int)local_80 == 0)) {
LAB_0020dd4c:
            dVar2 = (pIVar14->ExtentsX).Min;
            dVar13 = dVar27;
            if (dVar2 <= dVar27) {
              dVar13 = dVar2;
            }
            (pIVar14->ExtentsX).Min = dVar13;
            dVar2 = (pIVar14->ExtentsX).Max;
            dVar13 = dVar27;
            if (dVar27 <= dVar2) {
              dVar13 = dVar2;
            }
            (pIVar14->ExtentsX).Max = dVar13;
          }
        }
        else if (((pIVar12->YAxis[iVar6].Range.Min <= dVar26) &&
                 (dVar26 <= pIVar12->YAxis[iVar6].Range.Max)) && ((sVar3 < 1 & local_94._0_1_) == 0)
                ) goto LAB_0020dd4c;
        if ((uVar8 >> 10 & 1) == 0) {
          if ((0 < sVar4) || (local_8c == 0)) {
LAB_0020dda9:
            dVar27 = dVar26;
            if (pIVar22->Min <= dVar26) {
              dVar27 = pIVar22->Min;
            }
            pIVar22->Min = dVar27;
            dVar27 = pIVar14->ExtentsY[iVar6].Max;
            if (dVar26 <= dVar27) {
              dVar26 = dVar27;
            }
            pIVar14->ExtentsY[iVar6].Max = dVar26;
          }
        }
        else if ((((pIVar12->XAxis).Range.Min <= dVar27) && (dVar27 <= (pIVar12->XAxis).Range.Max))
                && ((sVar4 < 1 & (byte)local_90) == 0)) goto LAB_0020dda9;
        sVar3 = *(short *)((long)psVar19 +
                          (long)(((iVar10 + iVar24) % iVar5 + iVar5) % iVar5) * (long)iVar11);
        dVar27 = (double)(int)sVar3;
        if ((uVar7 >> 10 & 1) == 0) {
          if (((uVar7 & 0x20) == 0) || (0 < sVar3)) {
LAB_0020de1f:
            uVar28 = SUB84(dVar27,0);
            uVar31 = (undefined4)((ulong)dVar27 >> 0x20);
            dVar26 = (pIVar14->ExtentsX).Min;
            uVar29 = uVar28;
            uVar32 = uVar31;
            if (dVar26 <= dVar27) {
              uVar29 = SUB84(dVar26,0);
              uVar32 = (undefined4)((ulong)dVar26 >> 0x20);
            }
            (pIVar14->ExtentsX).Min = (double)CONCAT44(uVar32,uVar29);
            dVar26 = (pIVar14->ExtentsX).Max;
            if (dVar27 <= dVar26) {
              uVar28 = SUB84(dVar26,0);
              uVar31 = (undefined4)((ulong)dVar26 >> 0x20);
            }
            (pIVar14->ExtentsX).Max = (double)CONCAT44(uVar31,uVar28);
          }
        }
        else if (((pIVar12->YAxis[iVar6].Range.Min <= dVar1) &&
                 (dVar1 <= pIVar12->YAxis[iVar6].Range.Max)) &&
                (((byte)uVar7 >> 5 & sVar3 < 1) == 0)) goto LAB_0020de1f;
        if ((uVar8 >> 10 & 1) == 0) {
          if (bVar20 == 0) {
LAB_0020de55:
            dVar27 = dVar1;
            if (pIVar22->Min <= dVar1) {
              dVar27 = pIVar22->Min;
            }
            pIVar22->Min = dVar27;
            dVar27 = pIVar14->ExtentsY[iVar6].Max;
            dVar26 = dVar1;
            if (dVar1 <= dVar27) {
              dVar26 = dVar27;
            }
            pIVar14->ExtentsY[iVar6].Max = dVar26;
          }
        }
        else if ((local_58 < (short *)0x7ff0000000000000 && bVar18 == 0) &&
                 ((pIVar12->XAxis).Range.Min <= dVar27 && dVar27 <= (pIVar12->XAxis).Range.Max))
        goto LAB_0020de55;
        iVar24 = iVar24 + 1;
      } while (iVar5 != iVar24);
    }
    local_88 = get_base;
    local_70 = get_mark;
    local_80 = GetPlotDrawList();
    getter1 = local_70;
    if ((pIVar14->NextItemData).RenderLine == true) {
      col = ImGui::GetColorU32((pIVar14->NextItemData).Colors);
      iVar5 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar5]) {
      case 0:
        local_a0 = CONCAT44(local_a0._4_4_,iVar5);
        RenderLineSegments<ImPlot::GetterXsYs<short>,ImPlot::GetterXsYRef<short>,ImPlot::TransformerLinLin>
                  (getter1,local_88,(TransformerLinLin *)&local_a0,local_80,
                   (pIVar14->NextItemData).LineWeight,col);
        break;
      case 1:
        local_a0 = CONCAT44(local_a0._4_4_,iVar5);
        RenderLineSegments<ImPlot::GetterXsYs<short>,ImPlot::GetterXsYRef<short>,ImPlot::TransformerLogLin>
                  (getter1,local_88,(TransformerLogLin *)&local_a0,local_80,
                   (pIVar14->NextItemData).LineWeight,col);
        break;
      case 2:
        local_a0 = CONCAT44(local_a0._4_4_,iVar5);
        RenderLineSegments<ImPlot::GetterXsYs<short>,ImPlot::GetterXsYRef<short>,ImPlot::TransformerLinLog>
                  (getter1,local_88,(TransformerLinLog *)&local_a0,local_80,
                   (pIVar14->NextItemData).LineWeight,col);
        break;
      case 3:
        local_a0 = CONCAT44(local_a0._4_4_,iVar5);
        RenderLineSegments<ImPlot::GetterXsYs<short>,ImPlot::GetterXsYRef<short>,ImPlot::TransformerLogLog>
                  (getter1,local_88,(TransformerLogLog *)&local_a0,local_80,
                   (pIVar14->NextItemData).LineWeight,col);
      }
    }
    iVar5 = (pIVar14->NextItemData).Marker;
    iVar23 = 0;
    if (iVar5 != -1) {
      iVar23 = iVar5;
    }
    PopPlotClipRect();
    PushPlotClipRect((pIVar14->NextItemData).MarkerSize);
    local_8c = ImGui::GetColorU32((pIVar14->NextItemData).Colors + 2);
    local_90 = ImGui::GetColorU32((pIVar14->NextItemData).Colors + 3);
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    lVar16 = (long)transformer.YAxis;
    local_38 = GImPlot;
    local_78 = (short *)lVar16;
    switch(GImPlot->Scales[lVar16]) {
    case 0:
      iVar5 = getter1->Count;
      if (0 < iVar5) {
        psVar19 = getter1->Xs;
        psVar21 = getter1->Ys;
        iVar6 = getter1->Offset;
        local_58 = (short *)CONCAT44(local_58._4_4_,(pIVar14->NextItemData).MarkerSize);
        local_60 = CONCAT44(local_60._4_4_,(pIVar14->NextItemData).MarkerWeight);
        iVar10 = getter1->Stride;
        local_68 = (long)iVar23;
        iVar23 = 0;
        local_94 = (float)(uint)(pIVar14->NextItemData).RenderMarkerLine;
        local_70 = (GetterXsYs<short> *)
                   CONCAT44(local_70._4_4_,(uint)(pIVar14->NextItemData).RenderMarkerFill);
        local_50 = psVar19;
        local_48 = psVar21;
        do {
          lVar17 = (long)(((iVar6 + iVar23) % iVar5 + iVar5) % iVar5) * (long)iVar10;
          fVar25 = (float)(((double)(int)*(short *)((long)psVar19 + lVar17) -
                           (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                          (double)GImPlot->PixelRange[lVar16].Min.x);
          fVar30 = (float)(((double)(int)*(short *)((long)psVar21 + lVar17) -
                           GImPlot->CurrentPlot->YAxis[lVar16].Range.Min) *
                           GImPlot->My[(long)local_78] + (double)GImPlot->PixelRange[lVar16].Min.y);
          local_a0 = CONCAT44(fVar30,fVar25);
          pIVar12 = local_38->CurrentPlot;
          if ((((pIVar12->PlotRect).Min.x <= fVar25) && ((pIVar12->PlotRect).Min.y <= fVar30)) &&
             ((fVar25 < (pIVar12->PlotRect).Max.x && (fVar30 < (pIVar12->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<short>>(ImPlot::GetterXsYs<short>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_68 * 8))
                      (local_80,&local_a0,local_94,local_8c,(ulong)local_70 & 0xffffffff,local_90);
            psVar19 = local_50;
            psVar21 = local_48;
          }
          iVar23 = iVar23 + 1;
        } while (iVar5 != iVar23);
      }
      break;
    case 1:
      iVar5 = getter1->Count;
      if (0 < iVar5) {
        local_50 = getter1->Xs;
        local_58 = getter1->Ys;
        local_60 = (ulong)(uint)getter1->Offset;
        local_94 = (pIVar14->NextItemData).MarkerSize;
        local_88 = (GetterXsYRef<short> *)
                   CONCAT44(local_88._4_4_,(pIVar14->NextItemData).MarkerWeight);
        local_68 = (long)getter1->Stride;
        local_70 = (GetterXsYs<short> *)(long)iVar23;
        iVar23 = 0;
        local_3c = (uint)(pIVar14->NextItemData).RenderMarkerLine;
        bVar15 = (pIVar14->NextItemData).RenderMarkerFill;
        do {
          pIVar14 = GImPlot;
          lVar17 = ((((int)local_60 + iVar23) % iVar5 + iVar5) % iVar5) * local_68;
          local_48 = (short *)(double)(int)*(short *)((long)local_58 + lVar17);
          dVar27 = log10((double)(int)*(short *)((long)local_50 + lVar17) /
                         (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar12 = pIVar14->CurrentPlot;
          dVar1 = (pIVar12->XAxis).Range.Min;
          fVar25 = (float)((((double)(float)(dVar27 / pIVar14->LogDenX) *
                             ((pIVar12->XAxis).Range.Max - dVar1) + dVar1) - dVar1) * pIVar14->Mx +
                          (double)pIVar14->PixelRange[lVar16].Min.x);
          fVar30 = (float)(((double)local_48 - pIVar12->YAxis[lVar16].Range.Min) *
                           pIVar14->My[(long)local_78] + (double)pIVar14->PixelRange[lVar16].Min.y);
          local_a0 = CONCAT44(fVar30,fVar25);
          pIVar12 = local_38->CurrentPlot;
          if (((((pIVar12->PlotRect).Min.x <= fVar25) && ((pIVar12->PlotRect).Min.y <= fVar30)) &&
              (fVar25 < (pIVar12->PlotRect).Max.x)) && (fVar30 < (pIVar12->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<short>>(ImPlot::GetterXsYs<short>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)local_70 * 8))
                      (local_80,&local_a0,local_3c,local_8c,bVar15,local_90);
          }
          iVar23 = iVar23 + 1;
        } while (iVar5 != iVar23);
      }
      break;
    case 2:
      iVar5 = getter1->Count;
      if (0 < iVar5) {
        local_50 = getter1->Xs;
        local_58 = getter1->Ys;
        local_60 = (ulong)(uint)getter1->Offset;
        local_94 = (pIVar14->NextItemData).MarkerSize;
        local_88 = (GetterXsYRef<short> *)
                   CONCAT44(local_88._4_4_,(pIVar14->NextItemData).MarkerWeight);
        local_68 = (long)getter1->Stride;
        local_70 = (GetterXsYs<short> *)(long)iVar23;
        iVar23 = 0;
        local_3c = (uint)(pIVar14->NextItemData).RenderMarkerLine;
        bVar15 = (pIVar14->NextItemData).RenderMarkerFill;
        do {
          pIVar14 = GImPlot;
          lVar17 = ((((int)local_60 + iVar23) % iVar5 + iVar5) % iVar5) * local_68;
          local_48 = (short *)(double)(int)*(short *)((long)local_50 + lVar17);
          dVar27 = log10((double)(int)*(short *)((long)local_58 + lVar17) /
                         GImPlot->CurrentPlot->YAxis[lVar16].Range.Min);
          pIVar12 = pIVar14->CurrentPlot;
          dVar1 = pIVar12->YAxis[lVar16].Range.Min;
          fVar30 = (float)(((double)local_48 - (pIVar12->XAxis).Range.Min) * pIVar14->Mx +
                          (double)pIVar14->PixelRange[lVar16].Min.x);
          fVar25 = (float)((((double)(float)(dVar27 / pIVar14->LogDenY[(long)local_78]) *
                             (pIVar12->YAxis[lVar16].Range.Max - dVar1) + dVar1) - dVar1) *
                           pIVar14->My[(long)local_78] + (double)pIVar14->PixelRange[lVar16].Min.y);
          local_a0 = CONCAT44(fVar25,fVar30);
          pIVar12 = local_38->CurrentPlot;
          if ((((pIVar12->PlotRect).Min.x <= fVar30) && ((pIVar12->PlotRect).Min.y <= fVar25)) &&
             ((fVar30 < (pIVar12->PlotRect).Max.x && (fVar25 < (pIVar12->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<short>>(ImPlot::GetterXsYs<short>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)local_70 * 8))
                      (local_80,&local_a0,local_3c,local_8c,bVar15,local_90);
          }
          iVar23 = iVar23 + 1;
        } while (iVar5 != iVar23);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<short>>
                (*getter1,transformer,local_80,iVar23,(pIVar14->NextItemData).MarkerSize,
                 (pIVar14->NextItemData).RenderMarkerLine,local_8c,
                 (pIVar14->NextItemData).MarkerWeight,(pIVar14->NextItemData).RenderMarkerFill,
                 local_90);
    }
    pIVar14 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar14->NextItemData);
    pIVar14->PreviousItem = pIVar14->CurrentItem;
    pIVar14->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotStemsEx(const char* label_id, const GetterM& get_mark, const GetterB& get_base) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < get_base.Count; ++i) {
                FitPoint(get_mark(i));
                FitPoint(get_base(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_mark, get_base, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_mark, get_base, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_mark, get_base, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_mark, get_base, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(get_mark, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(get_mark, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(get_mark, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(get_mark, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}